

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O3

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoPyramid> *this,TPZGeoBlend<pzgeom::TPZGeoPyramid> *cp,
          TPZGeoMesh *destmesh)

{
  int64_t iVar1;
  TPZGeoEl *pTVar2;
  int64_t iVar3;
  int64_t iVar4;
  long lVar5;
  TPZGeoEl **ppTVar6;
  TPZTransform<double> *t;
  TPZTransform<double> *this_00;
  
  (this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.super_TPZPyramid.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_01892d08;
  iVar1 = (cp->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes[1];
  iVar3 = (cp->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes[2];
  iVar4 = (cp->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes[3];
  (this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes[0] =
       (cp->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes[0];
  (this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes[1] = iVar1;
  (this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes[2] = iVar3;
  (this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes[3] = iVar4;
  (this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes[4] =
       (cp->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes[4];
  (this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.super_TPZPyramid.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_0188eb58;
  lVar5 = 0x48;
  do {
    *(undefined ***)
     ((long)(this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes +
     lVar5 + -0x18) = &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)
     ((long)(this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes +
     lVar5 + -8) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->super_TPZGeoPyramid).super_TPZNodeRep<5,_pztopology::TPZPyramid>.fNodeIndexes +
     lVar5 + -0x10) = 0xffffffffffffffff;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x1b0);
  this_00 = (TPZTransform<double> *)&this->field_0x1a0;
  lVar5 = 0;
  do {
    TPZTransform<double>::TPZTransform((TPZTransform<double> *)((long)this_00 + lVar5));
    lVar5 = lVar5 + 0x1a0;
  } while (lVar5 != 0x1860);
  iVar1 = cp->fGeoEl->fIndex;
  t = (TPZTransform<double> *)&cp->field_0x1a0;
  lVar5 = 0;
  do {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar5) =
         *(undefined8 *)((long)&cp->fNeighbours[0].fGeoElIndex + lVar5);
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar5) =
         *(undefined4 *)((long)&cp->fNeighbours[0].fSide + lVar5);
    TPZTransform<double>::operator=(this_00,t);
    lVar5 = lVar5 + 0x18;
    t = t + 1;
    this_00 = this_00 + 1;
  } while (lVar5 != 0x168);
  ppTVar6 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                      (&(destmesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,iVar1);
  pTVar2 = *ppTVar6;
  this->fGeoEl = pTVar2;
  if (pTVar2 == (TPZGeoEl *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
               ,0x1d);
  }
  return;
}

Assistant:

pzgeom::TPZGeoBlend<TGeo>::TPZGeoBlend(const TPZGeoBlend<TGeo> &cp, TPZGeoMesh &destmesh) : TPZRegisterClassId(&TPZGeoBlend<TGeo>::ClassId), TGeo(cp,destmesh)
{
    int64_t gelindex = cp.fGeoEl->Index();
    for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
        fNeighbours[is] =  cp.fNeighbours[is];
        fTrans[is] =  cp.fTrans[is];
    }
    fGeoEl = destmesh.Element(gelindex);
    if(!fGeoEl) DebugStop();
}